

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  CTInfo CVar1;
  jit_State *cts_00;
  long *in_RSI;
  long in_RDI;
  CType *ct;
  CTSize sz;
  CTSize step;
  TRef trfill;
  TRef trlen;
  TRef trdst;
  CTState *cts;
  CType *ct_1;
  TValue *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  TRef sp;
  undefined4 in_stack_ffffffffffffff08;
  CTSize in_stack_ffffffffffffff0c;
  uint uVar2;
  int iVar3;
  CType *local_c8;
  CType *local_b0;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  jit_State *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  jit_State *in_stack_ffffffffffffffa8;
  
  sp = (TRef)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  cts_00 = (jit_State *)(ulong)*(uint *)(in_RDI + -0xb4);
  iVar3 = *(int *)(*(long *)(in_RDI + 0x88) + 8);
  if ((**(int **)(in_RDI + 0x88) != 0) && (*(int *)(*(long *)(in_RDI + 0x88) + 4) != 0)) {
    uVar2 = 1;
    if (*(int *)(*in_RSI + 4) == -0xb) {
      in_stack_ffffffffffffffa4 = (uint)*(ushort *)((ulong)*(uint *)*in_RSI + 6);
      for (local_c8 = *(CType **)&cts_00->cur + in_stack_ffffffffffffffa4;
          local_c8->info >> 0x1c == 8;
          local_c8 = *(CType **)&cts_00->cur + (local_c8->info & 0xffff)) {
      }
      if (local_c8->info >> 0x1c == 2) {
        local_b0 = local_c8;
        do {
          in_stack_ffffffffffffff94 = local_b0->info & 0xffff;
          local_c8 = *(CType **)&cts_00->cur + in_stack_ffffffffffffff94;
          local_b0 = local_c8;
          in_stack_ffffffffffffff98 = cts_00;
        } while (local_c8->info >> 0x1c == 8);
      }
      CVar1 = lj_ctype_info((CTState *)cts_00,
                            (CTypeID)((long)local_c8 - (long)*(CType **)&cts_00->cur >> 4),
                            (CTSize *)&stack0xffffffffffffff0c);
      sp = (TRef)((ulong)local_c8 >> 0x20);
      uVar2 = 1 << ((byte)(CVar1 >> 0x10) & 0xf);
      in_stack_ffffffffffffffa8 = cts_00;
    }
    crec_ct_tv(in_stack_ffffffffffffffa8,
               (CType *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (TRef)((ulong)in_stack_ffffffffffffff98 >> 0x20),(TRef)in_stack_ffffffffffffff98,
               (cTValue *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    crec_toint((jit_State *)CONCAT44(iVar3,uVar2),
               (CTState *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),sp,
               in_stack_fffffffffffffef8);
    if (iVar3 == 0) {
      lj_ir_kint((jit_State *)(ulong)uVar2,in_stack_ffffffffffffff0c);
    }
    else {
      crec_toint((jit_State *)CONCAT44(iVar3,uVar2),
                 (CTState *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),sp,
                 in_stack_fffffffffffffef8);
    }
    in_RSI[1] = 0;
    crec_fill((jit_State *)rd,cts._4_4_,(TRef)cts,trdst,trlen);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}